

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

string * __thiscall
pbrt::PiecewiseConstant2D::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PiecewiseConstant2D *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Bounds2<float>const&,pstd::vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>const&,pbrt::PiecewiseConstant1D_const&>
            (__return_storage_ptr__,
             "[ PiecewiseConstant2D domain: %s pConditionalV: %s pMarginal: %s ]",&this->domain,
             &this->pConditionalV,&this->pMarginal);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ PiecewiseConstant2D domain: %s pConditionalV: %s "
                            "pMarginal: %s ]",
                            domain, pConditionalV, pMarginal);
    }